

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_node<std::ostream>
               (SingleTreeIndex *node,basic_ostream<char,_std::char_traits<char>_> *out)

{
  size_type sVar1;
  void *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t vec_size;
  
  if (!interrupt_switch) {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b0cf);
    if (sVar1 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x67b0e0);
      write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b0f1);
    }
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 1));
    write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b115);
    if (sVar1 != 0) {
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x67b12a);
      write_bytes<double>(in_RSI,sVar1,(ostream *)0x67b13b);
    }
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 2));
    write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b15f);
    if (sVar1 != 0) {
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x67b174);
      write_bytes<double>(in_RSI,sVar1,(ostream *)0x67b185);
    }
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI + 3);
    write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b1a9);
    if (sVar1 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x67b1be);
      write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b1cf);
    }
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI + 4);
    write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b1f3);
    if (sVar1 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x67b208);
      write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b219);
    }
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI + 5);
    write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b23d);
    if (sVar1 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x67b252);
      write_bytes<unsigned_long>(in_RSI,sVar1,(ostream *)0x67b263);
    }
    write_bytes<unsigned_long>
              (in_RSI,(size_t)in_RDI[6].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,(ostream *)0x67b285);
  }
  return;
}

Assistant:

void serialize_node(const SingleTreeIndex &node, otype &out)
{
    if (interrupt_switch) return;

    size_t vec_size = node.terminal_node_mappings.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.terminal_node_mappings.data(), vec_size, out);

    vec_size = node.node_distances.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<double>((void*)node.node_distances.data(), vec_size, out);

    vec_size = node.node_depths.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<double>((void*)node.node_depths.data(), vec_size, out);

    vec_size = node.reference_points.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.reference_points.data(), vec_size, out);

    vec_size = node.reference_indptr.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.reference_indptr.data(), vec_size, out);

    vec_size = node.reference_mapping.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.reference_mapping.data(), vec_size, out);

    vec_size = node.n_terminal;
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
}